

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

int png_image_write_init(png_imagep image)

{
  int iVar1;
  png_structp png_ptr_00;
  png_infop ppVar2;
  png_controlp ppVar3;
  png_infop info_ptr;
  png_structp png_ptr;
  
  png_ptr_00 = png_create_write_struct("1.6.44",image,png_safe_error,png_safe_warning);
  png_ptr = png_ptr_00;
  if (png_ptr_00 != (png_structp)0x0) {
    ppVar2 = png_create_info_struct(png_ptr_00);
    info_ptr = ppVar2;
    if (ppVar2 != (png_infop)0x0) {
      ppVar3 = (png_controlp)png_malloc_warn(png_ptr_00,0x30);
      if (ppVar3 != (png_controlp)0x0) {
        ppVar3->size = 0;
        *(undefined8 *)&ppVar3->field_0x28 = 0;
        ppVar3->error_buf = (png_voidp)0x0;
        ppVar3->memory = (png_const_bytep)0x0;
        ppVar3->png_ptr = png_ptr_00;
        ppVar3->info_ptr = ppVar2;
        ppVar3->field_0x28 = 1;
        image->opaque = ppVar3;
        return 1;
      }
      png_destroy_info_struct(png_ptr_00,&info_ptr);
    }
    png_destroy_write_struct(&png_ptr,(png_infopp)0x0);
  }
  iVar1 = png_image_error(image,"png_image_write_: out of memory");
  return iVar1;
}

Assistant:

static int
png_image_write_init(png_imagep image)
{
   png_structp png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, image,
       png_safe_error, png_safe_warning);

   if (png_ptr != NULL)
   {
      png_infop info_ptr = png_create_info_struct(png_ptr);

      if (info_ptr != NULL)
      {
         png_controlp control = png_voidcast(png_controlp,
             png_malloc_warn(png_ptr, (sizeof *control)));

         if (control != NULL)
         {
            memset(control, 0, (sizeof *control));

            control->png_ptr = png_ptr;
            control->info_ptr = info_ptr;
            control->for_write = 1;

            image->opaque = control;
            return 1;
         }

         /* Error clean up */
         png_destroy_info_struct(png_ptr, &info_ptr);
      }

      png_destroy_write_struct(&png_ptr, NULL);
   }

   return png_image_error(image, "png_image_write_: out of memory");
}